

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.cpp
# Opt level: O1

int mbedtls_asn1_write_named_bitstring(uchar **p,uchar *start,uchar *buf,size_t bits)

{
  int iVar1;
  uint uVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (bits == 0) {
LAB_004adb20:
    bits = 0;
  }
  else {
    uVar2 = ((uint)(bits + 7) & 0xf8) - (int)bits;
    uVar5 = bits + 7 >> 3;
    uVar4 = (ulong)(buf[uVar5 - 1] >> ((byte)uVar2 & 0x1f));
    if ((buf[uVar5 - 1] >> (uVar2 & 0x1f) & 1) == 0) {
      puVar3 = buf + (uVar5 - 1);
      uVar5 = bits - 1;
      do {
        bits = uVar5;
        if (bits == 0) goto LAB_004adb20;
        if ((bits & 7) == 0) {
          uVar4 = (ulong)puVar3[-1];
          puVar3 = puVar3 + -1;
        }
        else {
          uVar4 = uVar4 >> 1;
        }
        uVar5 = bits - 1;
      } while ((uVar4 & 1) == 0);
    }
  }
  iVar1 = mbedtls_asn1_write_bitstring(p,start,buf,bits);
  return iVar1;
}

Assistant:

int mbedtls_asn1_write_named_bitstring(unsigned char **p,
                                       const unsigned char *start,
                                       const unsigned char *buf,
                                       size_t bits)
{
    size_t unused_bits, byte_len;
    const unsigned char *cur_byte;
    unsigned char cur_byte_shifted;
    unsigned char bit;

    byte_len = (bits + 7) / 8;
    unused_bits = (byte_len * 8) - bits;

    /*
     * Named bitstrings require that trailing 0s are excluded in the encoding
     * of the bitstring. Trailing 0s are considered part of the 'unused' bits
     * when encoding this value in the first content octet
     */
    if (bits != 0) {
        cur_byte = buf + byte_len - 1;
        cur_byte_shifted = *cur_byte >> unused_bits;

        for (;;) {
            bit = cur_byte_shifted & 0x1;
            cur_byte_shifted >>= 1;

            if (bit != 0) {
                break;
            }

            bits--;
            if (bits == 0) {
                break;
            }

            if (bits % 8 == 0) {
                cur_byte_shifted = *--cur_byte;
            }
        }
    }

    return mbedtls_asn1_write_bitstring(p, start, buf, bits);
}